

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O3

int side3_7d_filter(double *p0,double *p1,double *p2,double *p3,double *q0,double *q1,double *q2)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar27;
  undefined1 auVar26 [16];
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar35;
  double dVar41;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  double dVar34;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  double dVar52;
  double dVar53;
  double dVar54;
  double dVar55;
  double dVar56;
  double dVar57;
  double dVar58;
  double dVar59;
  double dVar60;
  double dVar61;
  double dVar62;
  double dVar63;
  double dVar64;
  double dVar65;
  double dVar66;
  double dVar68;
  undefined1 auVar67 [16];
  double dVar69;
  double dVar70;
  double dVar71;
  double dVar72;
  double dVar73;
  double dStack_130;
  
  dVar61 = p0[2];
  dVar54 = p1[2] - dVar61;
  dVar57 = p0[3];
  dVar70 = p1[3] - dVar57;
  dVar52 = p0[4];
  dVar28 = p1[4] - dVar52;
  dVar24 = p0[5];
  dVar50 = p1[5] - dVar24;
  dVar71 = p0[6];
  dVar59 = p1[6] - dVar71;
  dVar31 = *p0;
  dVar66 = p0[1];
  dVar16 = p1[1] - dVar66;
  dVar45 = ABS(dVar70);
  if (ABS(dVar70) <= ABS(dVar16)) {
    dVar45 = ABS(dVar16);
  }
  dVar44 = ABS(dVar50);
  if (ABS(dVar50) <= dVar45) {
    dVar44 = dVar45;
  }
  dVar45 = ABS(dVar28);
  if (ABS(dVar28) <= dVar44) {
    dVar45 = dVar44;
  }
  dVar44 = ABS(dVar59);
  if (ABS(dVar59) <= dVar45) {
    dVar44 = dVar45;
  }
  dVar45 = ABS(dVar54);
  if (ABS(dVar54) <= dVar44) {
    dVar45 = dVar44;
  }
  dVar55 = *p1 - dVar31;
  dVar44 = ABS(dVar55);
  if (ABS(dVar55) <= dVar45) {
    dVar44 = dVar45;
  }
  dVar45 = *q0 - dVar31;
  dVar8 = q0[1] - dVar66;
  auVar1._8_4_ = SUB84(dVar8,0);
  auVar1._0_8_ = dVar45;
  auVar1._12_4_ = (int)((ulong)dVar8 >> 0x20);
  dVar18 = ABS(dVar8);
  if (ABS(dVar8) <= ABS(dVar45)) {
    dVar18 = ABS(dVar45);
  }
  dVar8 = q0[2] - dVar61;
  dVar3 = ABS(dVar8);
  if (ABS(dVar8) <= dVar18) {
    dVar3 = dVar18;
  }
  dVar17 = q0[3] - dVar57;
  dVar18 = ABS(dVar17);
  if (ABS(dVar17) <= dVar3) {
    dVar18 = dVar3;
  }
  dVar3 = q0[4] - dVar52;
  dVar4 = ABS(dVar3);
  if (ABS(dVar3) <= dVar18) {
    dVar4 = dVar18;
  }
  dVar29 = q0[5] - dVar24;
  dVar18 = ABS(dVar29);
  if (ABS(dVar29) <= dVar4) {
    dVar18 = dVar4;
  }
  dVar62 = q0[6] - dVar71;
  dVar4 = ABS(dVar62);
  if (ABS(dVar62) <= dVar18) {
    dVar4 = dVar18;
  }
  dVar19 = *q1 - dVar31;
  dVar18 = ABS(dVar19);
  if (ABS(dVar19) <= dVar4) {
    dVar18 = dVar4;
  }
  dVar4 = q1[1] - dVar66;
  dVar5 = ABS(dVar4);
  if (ABS(dVar4) <= dVar18) {
    dVar5 = dVar18;
  }
  dVar20 = q1[2] - dVar61;
  dVar18 = ABS(dVar20);
  if (ABS(dVar20) <= dVar5) {
    dVar18 = dVar5;
  }
  dVar5 = q1[3] - dVar57;
  dVar6 = ABS(dVar5);
  if (ABS(dVar5) <= dVar18) {
    dVar6 = dVar18;
  }
  dVar21 = q1[4] - dVar52;
  dVar18 = ABS(dVar21);
  if (ABS(dVar21) <= dVar6) {
    dVar18 = dVar6;
  }
  dVar6 = q1[5] - dVar24;
  dVar7 = ABS(dVar6);
  if (ABS(dVar6) <= dVar18) {
    dVar7 = dVar18;
  }
  dVar60 = q1[6] - dVar71;
  dVar18 = ABS(dVar60);
  if (ABS(dVar60) <= dVar7) {
    dVar18 = dVar7;
  }
  dVar7 = *q2 - dVar31;
  dVar9 = ABS(dVar7);
  if (ABS(dVar7) <= dVar18) {
    dVar9 = dVar18;
  }
  dVar22 = *p2 - dVar31;
  auVar40._0_8_ = ABS(dVar22);
  auVar40._8_8_ = dVar9;
  dVar33 = p2[1] - dVar66;
  dVar41 = q2[1] - dVar66;
  auVar36._0_8_ = ABS(dVar33);
  auVar36._8_8_ = ABS(dVar41);
  auVar37 = maxpd(auVar36,auVar40);
  dVar65 = p2[2] - dVar61;
  dVar68 = q2[2] - dVar61;
  auVar67._0_8_ = ABS(dVar65);
  auVar67._8_8_ = ABS(dVar68);
  auVar37 = maxpd(auVar67,auVar37);
  dVar23 = p2[4] - dVar52;
  dVar27 = q2[4] - dVar52;
  dVar18 = p2[5] - dVar24;
  dVar9 = q2[5] - dVar24;
  dVar46 = p2[6] - dVar71;
  dVar48 = q2[6] - dVar71;
  dVar34 = p2[3] - dVar57;
  dVar72 = q2[3] - dVar57;
  auVar38._0_8_ = ABS(dVar34);
  auVar38._8_8_ = ABS(dVar72);
  auVar37 = maxpd(auVar38,auVar37);
  auVar26._0_8_ = ABS(dVar23);
  auVar26._8_8_ = ABS(dVar27);
  auVar37 = maxpd(auVar26,auVar37);
  auVar39._0_8_ = ABS(dVar18);
  auVar39._8_8_ = ABS(dVar9);
  auVar40 = maxpd(auVar39,auVar37);
  auVar37._0_8_ = ABS(dVar46);
  auVar37._8_8_ = ABS(dVar48);
  auVar37 = maxpd(auVar37,auVar40);
  dVar14 = auVar37._0_8_;
  dVar15 = auVar37._8_8_;
  dVar30 = dVar44;
  if ((dVar44 < dVar14) || (dVar30 = dVar14, dVar35 = dVar44, dVar44 <= dVar14)) {
    dVar35 = dVar14;
  }
  dVar42 = dVar15;
  if ((dVar30 <= dVar15) && (dVar42 = dVar30, dVar35 < dVar15)) {
    dVar35 = dVar15;
  }
  iVar12 = 0;
  iVar11 = 0;
  if ((1.369188811838835e-74 <= dVar42) && (iVar11 = iVar12, dVar35 <= 1.2980742146337065e+33)) {
    dStack_130 = auVar1._8_8_;
    auVar2._8_4_ = SUB84(dVar9,0);
    auVar2._0_8_ = dVar18;
    auVar2._12_4_ = (int)((ulong)dVar9 >> 0x20);
    dVar58 = auVar2._8_8_;
    dVar9 = dVar59 * dVar62 +
            dVar50 * dVar29 +
            dVar28 * dVar3 +
            dVar70 * dVar17 + dVar54 * dVar8 + dVar55 * dVar45 + dVar16 * dStack_130;
    dVar56 = dVar59 * dVar60 +
             dVar50 * dVar6 +
             dVar28 * dVar21 + dVar70 * dVar5 + dVar54 * dVar20 + dVar55 * dVar19 + dVar16 * dVar4;
    dVar49 = dVar59 * dVar48 +
             dVar50 * dVar58 +
             dVar28 * dVar27 + dVar70 * dVar72 + dVar54 * dVar68 + dVar55 * dVar7 + dVar16 * dVar41;
    dVar30 = dVar46 * dVar62 +
             dVar18 * dVar29 +
             dVar23 * dVar3 +
             dVar34 * dVar17 + dVar65 * dVar8 + dVar22 * dVar45 + dVar33 * dStack_130;
    dVar35 = dVar46 * dVar60 +
             dVar18 * dVar6 +
             dVar23 * dVar21 + dVar34 * dVar5 + dVar65 * dVar20 + dVar22 * dVar19 + dVar33 * dVar4;
    dVar73 = dVar46 * dVar48 +
             dVar18 * dVar58 +
             dVar23 * dVar27 + dVar34 * dVar72 + dVar65 * dVar68 + dVar22 * dVar7 + dVar33 * dVar41;
    dVar9 = dVar9 + dVar9;
    dVar56 = dVar56 + dVar56;
    dVar49 = dVar49 + dVar49;
    dVar30 = dVar30 + dVar30;
    dVar35 = dVar35 + dVar35;
    dVar73 = dVar73 + dVar73;
    dVar51 = dVar56 * dVar73 - dVar35 * dVar49;
    dVar42 = dVar49 * dVar30 - dVar73 * dVar9;
    dVar69 = dVar9 * dVar35 - dVar30 * dVar56;
    dVar47 = dVar51 + dVar42 + dVar69;
    dVar63 = dVar44 * dVar15 * dVar14 * dVar15 * 6.33127335329799e-13;
    iVar12 = 1;
    if ((dVar63 < dVar47) || (iVar12 = -1, dVar47 < -dVar63)) {
      dVar31 = *p3 - dVar31;
      dVar66 = p3[1] - dVar66;
      dVar61 = p3[2] - dVar61;
      dVar57 = p3[3] - dVar57;
      dVar52 = p3[4] - dVar52;
      dVar24 = p3[5] - dVar24;
      dVar71 = p3[6] - dVar71;
      dVar63 = ABS(dVar31);
      if (ABS(dVar31) <= dVar44) {
        dVar63 = dVar44;
      }
      dVar43 = ABS(dVar66);
      if (ABS(dVar66) <= dVar63) {
        dVar43 = dVar63;
      }
      dVar63 = ABS(dVar61);
      if (ABS(dVar61) <= dVar43) {
        dVar63 = dVar43;
      }
      dVar43 = ABS(dVar57);
      if (ABS(dVar57) <= dVar63) {
        dVar43 = dVar63;
      }
      dVar63 = ABS(dVar52);
      if (ABS(dVar52) <= dVar43) {
        dVar63 = dVar43;
      }
      dVar43 = ABS(dVar24);
      if (ABS(dVar24) <= dVar63) {
        dVar43 = dVar63;
      }
      dVar63 = dVar15;
      if (dVar15 <= dVar44) {
        dVar63 = dVar44;
      }
      dVar25 = dVar14;
      if (dVar14 <= dVar63) {
        dVar25 = dVar63;
      }
      dVar64 = ABS(dVar71);
      if (ABS(dVar71) <= dVar43) {
        dVar64 = dVar43;
      }
      dVar43 = dVar64;
      if (dVar64 <= dVar25) {
        dVar43 = dVar25;
      }
      dVar25 = dVar44;
      if (dVar44 <= dVar43) {
        dVar25 = dVar43;
      }
      dVar43 = dVar15;
      if (dVar15 <= dVar25) {
        dVar43 = dVar25;
      }
      dVar25 = dVar64;
      if (dVar64 <= dVar63) {
        dVar25 = dVar63;
      }
      if (dVar44 <= dVar25) {
        dVar44 = dVar25;
      }
      dVar25 = (double)(~-(ulong)(dVar14 < dVar63) & (ulong)dVar63 |
                       (ulong)dVar14 & -(ulong)(dVar14 < dVar63));
      dVar53 = (double)(~-(ulong)(dVar44 < dVar15) & (ulong)dVar44 |
                       (ulong)dVar15 & -(ulong)(dVar44 < dVar15));
      uVar13 = -(ulong)(dVar64 < dVar25);
      dVar25 = (double)(~uVar13 & (ulong)dVar25 | (ulong)dVar64 & uVar13);
      dVar32 = (double)(~-(ulong)(dVar43 < dVar53) & (ulong)dVar43 |
                       (ulong)dVar53 & -(ulong)(dVar43 < dVar53));
      dVar44 = dVar32;
      dVar43 = dVar63;
      if ((dVar25 <= dVar32) && (dVar44 = dVar25, dVar43 = dVar32, dVar32 <= dVar63)) {
        dVar43 = dVar63;
      }
      dVar25 = dVar15;
      if (dVar44 <= dVar15) {
        dVar25 = dVar44;
      }
      dVar44 = dVar53;
      if (dVar25 <= dVar53) {
        dVar44 = dVar25;
      }
      if ((3.045483035656025e-50 <= dVar44) && (dVar43 <= 1.2980742146337065e+33)) {
        dVar16 = dVar59 * dVar59 +
                 dVar50 * dVar50 +
                 dVar28 * dVar28 +
                 dVar70 * dVar70 + dVar54 * dVar54 + dVar55 * dVar55 + dVar16 * dVar16;
        dVar28 = dVar46 * dVar46 +
                 dVar18 * dVar18 +
                 dVar23 * dVar23 +
                 dVar34 * dVar34 + dVar65 * dVar65 + dVar22 * dVar22 + dVar33 * dVar33;
        dVar45 = dVar62 * dVar71 +
                 dVar29 * dVar24 +
                 dVar3 * dVar52 +
                 dVar17 * dVar57 + dVar8 * dVar61 + dVar45 * dVar31 + dStack_130 * dVar66;
        dVar50 = dVar60 * dVar71 +
                 dVar6 * dVar24 +
                 dVar21 * dVar52 +
                 dVar5 * dVar57 + dVar20 * dVar61 + dVar19 * dVar31 + dVar4 * dVar66;
        dVar54 = dVar48 * dVar71 +
                 dVar58 * dVar24 +
                 dVar27 * dVar52 +
                 dVar72 * dVar57 + dVar68 * dVar61 + dVar7 * dVar31 + dVar41 * dVar66;
        dVar59 = dVar64 * dVar15 * dVar14 * dVar63 * dVar53 * dVar32 * 2.7887354880433616e-11;
        dVar61 = dVar47 * (dVar71 * dVar71 +
                          dVar24 * dVar24 +
                          dVar52 * dVar52 +
                          dVar57 * dVar57 + dVar61 * dVar61 + dVar31 * dVar31 + dVar66 * dVar66) -
                 ((dVar69 + (dVar30 - dVar35) * dVar16 + (dVar56 - dVar9) * dVar28) *
                  (dVar54 + dVar54) +
                 (dVar42 + (dVar73 - dVar30) * dVar16 + (dVar9 - dVar49) * dVar28) *
                 (dVar50 + dVar50) +
                 (dVar51 + (dVar35 - dVar73) * dVar16 + (dVar49 - dVar56) * dVar28) *
                 (dVar45 + dVar45));
        iVar10 = 1;
        if ((dVar59 < dVar61) || (iVar10 = -1, dVar61 < -dVar59)) {
          iVar11 = iVar10 * iVar12;
        }
      }
    }
  }
  return iVar11;
}

Assistant:

inline int side3_7d_filter( const double* p0, const double* p1, const double* p2, const double* p3, const double* q0, const double* q1, const double* q2) {
    double p1_0_p0_0 = (p1[0] - p0[0]);
    double p1_1_p0_1 = (p1[1] - p0[1]);
    double p1_2_p0_2 = (p1[2] - p0[2]);
    double p1_3_p0_3 = (p1[3] - p0[3]);
    double p1_4_p0_4 = (p1[4] - p0[4]);
    double p1_5_p0_5 = (p1[5] - p0[5]);
    double p1_6_p0_6 = (p1[6] - p0[6]);
    double l1;
    l1 = (1 * (((((((p1_0_p0_0 * p1_0_p0_0) + (p1_1_p0_1 * p1_1_p0_1)) + (p1_2_p0_2 * p1_2_p0_2)) + (p1_3_p0_3 * p1_3_p0_3)) + (p1_4_p0_4 * p1_4_p0_4)) + (p1_5_p0_5 * p1_5_p0_5)) + (p1_6_p0_6 * p1_6_p0_6)));
    double p2_0_p0_0 = (p2[0] - p0[0]);
    double p2_1_p0_1 = (p2[1] - p0[1]);
    double p2_2_p0_2 = (p2[2] - p0[2]);
    double p2_3_p0_3 = (p2[3] - p0[3]);
    double p2_4_p0_4 = (p2[4] - p0[4]);
    double p2_5_p0_5 = (p2[5] - p0[5]);
    double p2_6_p0_6 = (p2[6] - p0[6]);
    double l2;
    l2 = (1 * (((((((p2_0_p0_0 * p2_0_p0_0) + (p2_1_p0_1 * p2_1_p0_1)) + (p2_2_p0_2 * p2_2_p0_2)) + (p2_3_p0_3 * p2_3_p0_3)) + (p2_4_p0_4 * p2_4_p0_4)) + (p2_5_p0_5 * p2_5_p0_5)) + (p2_6_p0_6 * p2_6_p0_6)));
    double p3_0_p0_0 = (p3[0] - p0[0]);
    double p3_1_p0_1 = (p3[1] - p0[1]);
    double p3_2_p0_2 = (p3[2] - p0[2]);
    double p3_3_p0_3 = (p3[3] - p0[3]);
    double p3_4_p0_4 = (p3[4] - p0[4]);
    double p3_5_p0_5 = (p3[5] - p0[5]);
    double p3_6_p0_6 = (p3[6] - p0[6]);
    double l3;
    l3 = (1 * (((((((p3_0_p0_0 * p3_0_p0_0) + (p3_1_p0_1 * p3_1_p0_1)) + (p3_2_p0_2 * p3_2_p0_2)) + (p3_3_p0_3 * p3_3_p0_3)) + (p3_4_p0_4 * p3_4_p0_4)) + (p3_5_p0_5 * p3_5_p0_5)) + (p3_6_p0_6 * p3_6_p0_6)));
    double q0_0_p0_0 = (q0[0] - p0[0]);
    double q0_1_p0_1 = (q0[1] - p0[1]);
    double q0_2_p0_2 = (q0[2] - p0[2]);
    double q0_3_p0_3 = (q0[3] - p0[3]);
    double q0_4_p0_4 = (q0[4] - p0[4]);
    double q0_5_p0_5 = (q0[5] - p0[5]);
    double q0_6_p0_6 = (q0[6] - p0[6]);
    double a10;
    a10 = (2 * (((((((p1_0_p0_0 * q0_0_p0_0) + (p1_1_p0_1 * q0_1_p0_1)) + (p1_2_p0_2 * q0_2_p0_2)) + (p1_3_p0_3 * q0_3_p0_3)) + (p1_4_p0_4 * q0_4_p0_4)) + (p1_5_p0_5 * q0_5_p0_5)) + (p1_6_p0_6 * q0_6_p0_6)));
    double q1_0_p0_0 = (q1[0] - p0[0]);
    double q1_1_p0_1 = (q1[1] - p0[1]);
    double q1_2_p0_2 = (q1[2] - p0[2]);
    double q1_3_p0_3 = (q1[3] - p0[3]);
    double q1_4_p0_4 = (q1[4] - p0[4]);
    double q1_5_p0_5 = (q1[5] - p0[5]);
    double q1_6_p0_6 = (q1[6] - p0[6]);
    double a11;
    a11 = (2 * (((((((p1_0_p0_0 * q1_0_p0_0) + (p1_1_p0_1 * q1_1_p0_1)) + (p1_2_p0_2 * q1_2_p0_2)) + (p1_3_p0_3 * q1_3_p0_3)) + (p1_4_p0_4 * q1_4_p0_4)) + (p1_5_p0_5 * q1_5_p0_5)) + (p1_6_p0_6 * q1_6_p0_6)));
    double q2_0_p0_0 = (q2[0] - p0[0]);
    double q2_1_p0_1 = (q2[1] - p0[1]);
    double q2_2_p0_2 = (q2[2] - p0[2]);
    double q2_3_p0_3 = (q2[3] - p0[3]);
    double q2_4_p0_4 = (q2[4] - p0[4]);
    double q2_5_p0_5 = (q2[5] - p0[5]);
    double q2_6_p0_6 = (q2[6] - p0[6]);
    double a12;
    a12 = (2 * (((((((p1_0_p0_0 * q2_0_p0_0) + (p1_1_p0_1 * q2_1_p0_1)) + (p1_2_p0_2 * q2_2_p0_2)) + (p1_3_p0_3 * q2_3_p0_3)) + (p1_4_p0_4 * q2_4_p0_4)) + (p1_5_p0_5 * q2_5_p0_5)) + (p1_6_p0_6 * q2_6_p0_6)));
    double a20;
    a20 = (2 * (((((((p2_0_p0_0 * q0_0_p0_0) + (p2_1_p0_1 * q0_1_p0_1)) + (p2_2_p0_2 * q0_2_p0_2)) + (p2_3_p0_3 * q0_3_p0_3)) + (p2_4_p0_4 * q0_4_p0_4)) + (p2_5_p0_5 * q0_5_p0_5)) + (p2_6_p0_6 * q0_6_p0_6)));
    double a21;
    a21 = (2 * (((((((p2_0_p0_0 * q1_0_p0_0) + (p2_1_p0_1 * q1_1_p0_1)) + (p2_2_p0_2 * q1_2_p0_2)) + (p2_3_p0_3 * q1_3_p0_3)) + (p2_4_p0_4 * q1_4_p0_4)) + (p2_5_p0_5 * q1_5_p0_5)) + (p2_6_p0_6 * q1_6_p0_6)));
    double a22;
    a22 = (2 * (((((((p2_0_p0_0 * q2_0_p0_0) + (p2_1_p0_1 * q2_1_p0_1)) + (p2_2_p0_2 * q2_2_p0_2)) + (p2_3_p0_3 * q2_3_p0_3)) + (p2_4_p0_4 * q2_4_p0_4)) + (p2_5_p0_5 * q2_5_p0_5)) + (p2_6_p0_6 * q2_6_p0_6)));
    double a30;
    a30 = (2 * (((((((p3_0_p0_0 * q0_0_p0_0) + (p3_1_p0_1 * q0_1_p0_1)) + (p3_2_p0_2 * q0_2_p0_2)) + (p3_3_p0_3 * q0_3_p0_3)) + (p3_4_p0_4 * q0_4_p0_4)) + (p3_5_p0_5 * q0_5_p0_5)) + (p3_6_p0_6 * q0_6_p0_6)));
    double a31;
    a31 = (2 * (((((((p3_0_p0_0 * q1_0_p0_0) + (p3_1_p0_1 * q1_1_p0_1)) + (p3_2_p0_2 * q1_2_p0_2)) + (p3_3_p0_3 * q1_3_p0_3)) + (p3_4_p0_4 * q1_4_p0_4)) + (p3_5_p0_5 * q1_5_p0_5)) + (p3_6_p0_6 * q1_6_p0_6)));
    double a32;
    a32 = (2 * (((((((p3_0_p0_0 * q2_0_p0_0) + (p3_1_p0_1 * q2_1_p0_1)) + (p3_2_p0_2 * q2_2_p0_2)) + (p3_3_p0_3 * q2_3_p0_3)) + (p3_4_p0_4 * q2_4_p0_4)) + (p3_5_p0_5 * q2_5_p0_5)) + (p3_6_p0_6 * q2_6_p0_6)));
    double b00;
    b00 = ((a11 * a22) - (a12 * a21));
    double b01;
    b01 = (a21 - a22);
    double b02;
    b02 = (a12 - a11);
    double b10;
    b10 = ((a12 * a20) - (a10 * a22));
    double b11;
    b11 = (a22 - a20);
    double b12;
    b12 = (a10 - a12);
    double b20;
    b20 = ((a10 * a21) - (a11 * a20));
    double b21;
    b21 = (a20 - a21);
    double b22;
    b22 = (a11 - a10);
    double Delta;
    Delta = ((b00 + b10) + b20);
    double DeltaLambda0;
    DeltaLambda0 = (((b01 * l1) + (b02 * l2)) + b00);
    double DeltaLambda1;
    DeltaLambda1 = (((b11 * l1) + (b12 * l2)) + b10);
    double DeltaLambda2;
    DeltaLambda2 = (((b21 * l1) + (b22 * l2)) + b20);
    double r;
    r = ((Delta * l3) - (((a30 * DeltaLambda0) + (a31 * DeltaLambda1)) + (a32 * DeltaLambda2)));
    double eps;
    double max1 = fabs(p1_1_p0_1);
    if( (max1 < fabs(p1_3_p0_3)) )
    {
        max1 = fabs(p1_3_p0_3);
    } 
    if( (max1 < fabs(p1_5_p0_5)) )
    {
        max1 = fabs(p1_5_p0_5);
    } 
    if( (max1 < fabs(p1_4_p0_4)) )
    {
        max1 = fabs(p1_4_p0_4);
    } 
    if( (max1 < fabs(p1_6_p0_6)) )
    {
        max1 = fabs(p1_6_p0_6);
    } 
    if( (max1 < fabs(p1_2_p0_2)) )
    {
        max1 = fabs(p1_2_p0_2);
    } 
    if( (max1 < fabs(p1_0_p0_0)) )
    {
        max1 = fabs(p1_0_p0_0);
    } 
    double max2 = fabs(p2_0_p0_0);
    if( (max2 < fabs(p2_1_p0_1)) )
    {
        max2 = fabs(p2_1_p0_1);
    } 
    if( (max2 < fabs(p2_2_p0_2)) )
    {
        max2 = fabs(p2_2_p0_2);
    } 
    if( (max2 < fabs(p2_3_p0_3)) )
    {
        max2 = fabs(p2_3_p0_3);
    } 
    if( (max2 < fabs(p2_4_p0_4)) )
    {
        max2 = fabs(p2_4_p0_4);
    } 
    if( (max2 < fabs(p2_5_p0_5)) )
    {
        max2 = fabs(p2_5_p0_5);
    } 
    if( (max2 < fabs(p2_6_p0_6)) )
    {
        max2 = fabs(p2_6_p0_6);
    } 
    double max3 = fabs(q0_0_p0_0);
    if( (max3 < fabs(q0_1_p0_1)) )
    {
        max3 = fabs(q0_1_p0_1);
    } 
    if( (max3 < fabs(q0_2_p0_2)) )
    {
        max3 = fabs(q0_2_p0_2);
    } 
    if( (max3 < fabs(q0_3_p0_3)) )
    {
        max3 = fabs(q0_3_p0_3);
    } 
    if( (max3 < fabs(q0_4_p0_4)) )
    {
        max3 = fabs(q0_4_p0_4);
    } 
    if( (max3 < fabs(q0_5_p0_5)) )
    {
        max3 = fabs(q0_5_p0_5);
    } 
    if( (max3 < fabs(q0_6_p0_6)) )
    {
        max3 = fabs(q0_6_p0_6);
    } 
    if( (max3 < fabs(q1_0_p0_0)) )
    {
        max3 = fabs(q1_0_p0_0);
    } 
    if( (max3 < fabs(q1_1_p0_1)) )
    {
        max3 = fabs(q1_1_p0_1);
    } 
    if( (max3 < fabs(q1_2_p0_2)) )
    {
        max3 = fabs(q1_2_p0_2);
    } 
    if( (max3 < fabs(q1_3_p0_3)) )
    {
        max3 = fabs(q1_3_p0_3);
    } 
    if( (max3 < fabs(q1_4_p0_4)) )
    {
        max3 = fabs(q1_4_p0_4);
    } 
    if( (max3 < fabs(q1_5_p0_5)) )
    {
        max3 = fabs(q1_5_p0_5);
    } 
    if( (max3 < fabs(q1_6_p0_6)) )
    {
        max3 = fabs(q1_6_p0_6);
    } 
    if( (max3 < fabs(q2_0_p0_0)) )
    {
        max3 = fabs(q2_0_p0_0);
    } 
    if( (max3 < fabs(q2_1_p0_1)) )
    {
        max3 = fabs(q2_1_p0_1);
    } 
    if( (max3 < fabs(q2_2_p0_2)) )
    {
        max3 = fabs(q2_2_p0_2);
    } 
    if( (max3 < fabs(q2_3_p0_3)) )
    {
        max3 = fabs(q2_3_p0_3);
    } 
    if( (max3 < fabs(q2_4_p0_4)) )
    {
        max3 = fabs(q2_4_p0_4);
    } 
    if( (max3 < fabs(q2_5_p0_5)) )
    {
        max3 = fabs(q2_5_p0_5);
    } 
    if( (max3 < fabs(q2_6_p0_6)) )
    {
        max3 = fabs(q2_6_p0_6);
    } 
    double lower_bound_1;
    double upper_bound_1;
    int Delta_sign;
    int int_tmp_result;
    lower_bound_1 = max2;
    upper_bound_1 = max2;
    if( (max1 < lower_bound_1) )
    {
        lower_bound_1 = max1;
    } 
    else 
    {
        if( (max1 > upper_bound_1) )
        {
            upper_bound_1 = max1;
        } 
    } 
    if( (max3 < lower_bound_1) )
    {
        lower_bound_1 = max3;
    } 
    else 
    {
        if( (max3 > upper_bound_1) )
        {
            upper_bound_1 = max3;
        } 
    } 
    if( (lower_bound_1 < 1.36918881183883509035e-74) )
    {
        return FPG_UNCERTAIN_VALUE;
    } 
    else 
    {
        if( (upper_bound_1 > 1.29807421463370647479e+33) )
        {
            return FPG_UNCERTAIN_VALUE;
        } 
        eps = (6.33127335329798996022e-13 * (((max1 * max3) * max2) * max3));
        if( (Delta > eps) )
        {
            int_tmp_result = 1;
        } 
        else 
        {
            if( (Delta < -eps) )
            {
                int_tmp_result = -1;
            } 
            else 
            {
                return FPG_UNCERTAIN_VALUE;
            } 
        } 
    } 
    Delta_sign = int_tmp_result;
    double max4;
    double max7 = max1;
    if( (max7 < max3) )
    {
        max7 = max3;
    } 
    max4 = max7;
    if( (max4 < max2) )
    {
        max4 = max2;
    } 
    double max5 = max1;
    if( (max5 < fabs(p3_0_p0_0)) )
    {
        max5 = fabs(p3_0_p0_0);
    } 
    if( (max5 < fabs(p3_1_p0_1)) )
    {
        max5 = fabs(p3_1_p0_1);
    } 
    if( (max5 < fabs(p3_2_p0_2)) )
    {
        max5 = fabs(p3_2_p0_2);
    } 
    if( (max5 < fabs(p3_3_p0_3)) )
    {
        max5 = fabs(p3_3_p0_3);
    } 
    if( (max5 < fabs(p3_4_p0_4)) )
    {
        max5 = fabs(p3_4_p0_4);
    } 
    if( (max5 < fabs(p3_5_p0_5)) )
    {
        max5 = fabs(p3_5_p0_5);
    } 
    if( (max5 < fabs(p3_6_p0_6)) )
    {
        max5 = fabs(p3_6_p0_6);
    } 
    if( (max4 < max5) )
    {
        max4 = max5;
    } 
    if( (max4 < max1) )
    {
        max4 = max1;
    } 
    if( (max4 < max3) )
    {
        max4 = max3;
    } 
    double max6 = max7;
    if( (max6 < max5) )
    {
        max6 = max5;
    } 
    if( (max6 < max1) )
    {
        max6 = max1;
    } 
    if( (max6 < max3) )
    {
        max6 = max3;
    } 
    if( (max4 < max6) )
    {
        max4 = max6;
    } 
    int r_sign;
    int int_tmp_result_FFWKCAA;
    lower_bound_1 = max7;
    upper_bound_1 = max7;
    if( (max2 < lower_bound_1) )
    {
        lower_bound_1 = max2;
    } 
    if( (max5 < lower_bound_1) )
    {
        lower_bound_1 = max5;
    } 
    if( (max4 < lower_bound_1) )
    {
        lower_bound_1 = max4;
    } 
    else 
    {
        if( (max4 > upper_bound_1) )
        {
            upper_bound_1 = max4;
        } 
    } 
    if( (max3 < lower_bound_1) )
    {
        lower_bound_1 = max3;
    } 
    if( (max6 < lower_bound_1) )
    {
        lower_bound_1 = max6;
    } 
    if( (lower_bound_1 < 3.04548303565602498901e-50) )
    {
        return FPG_UNCERTAIN_VALUE;
    } 
    else 
    {
        if( (upper_bound_1 > 1.29807421463370647479e+33) )
        {
            return FPG_UNCERTAIN_VALUE;
        } 
        eps = (2.78873548804336160566e-11 * (((((max5 * max3) * max2) * max7) * max6) * max4));
        if( (r > eps) )
        {
            int_tmp_result_FFWKCAA = 1;
        } 
        else 
        {
            if( (r < -eps) )
            {
                int_tmp_result_FFWKCAA = -1;
            } 
            else 
            {
                return FPG_UNCERTAIN_VALUE;
            } 
        } 
    } 
    r_sign = int_tmp_result_FFWKCAA;
    return (Delta_sign * r_sign);
}